

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.h
# Opt level: O3

void __thiscall
Measure<int>::Measure
          (Measure<int> *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *time,string *name,MetricType *type,int *value,vector<Tag,_std::allocator<Tag>_> *tags)

{
  pointer pcVar1;
  logger *this_00;
  
  (this->time).__d.__r = (time->__d).__r;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  this->type = *type;
  this->value = *value;
  this->rate = 1.0;
  std::vector<Tag,_std::allocator<Tag>_>::vector(&this->tags,tags);
  this_00 = spdlog::default_logger_raw();
  spdlog::logger::log(this_00,0.0);
  return;
}

Assistant:

Measure(const time_point<high_resolution_clock> &time, const std::string& name, const MetricType &type, const T& value, const std::vector<Tag>& tags)
        : time(time), name(name), type(type), rate(1.0f), value(value), tags(tags) {
        spdlog::debug("in measure constructor");
    }